

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.cc
# Opt level: O0

int pubkey_cb(int operation,ASN1_VALUE **pval,ASN1_ITEM *it,void *exarg)

{
  X509_PUBKEY *pubkey;
  void *exarg_local;
  ASN1_ITEM *it_local;
  ASN1_VALUE **pval_local;
  int operation_local;
  
  if (operation == 3) {
    EVP_PKEY_free((EVP_PKEY *)((X509_PUBKEY *)*pval)->pkey);
  }
  else if (operation == 5) {
    x509_pubkey_changed((X509_PUBKEY *)*pval);
  }
  return 1;
}

Assistant:

static int pubkey_cb(int operation, ASN1_VALUE **pval, const ASN1_ITEM *it,
                     void *exarg) {
  X509_PUBKEY *pubkey = (X509_PUBKEY *)*pval;
  if (operation == ASN1_OP_FREE_POST) {
    EVP_PKEY_free(pubkey->pkey);
  } else if (operation == ASN1_OP_D2I_POST) {
    x509_pubkey_changed(pubkey);
  }
  return 1;
}